

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
               (solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *slv,int k,bit_array *x)

{
  uint uVar1;
  bound_factor *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined1 local_30 [16];
  
  sparse_matrix<int>::row((sparse_matrix<int> *)local_30,(int)slv + 8);
  if (local_30._8_8_ == local_30._0_8_) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      uVar1 = *(uint *)(local_30._8_8_ + 4);
      uVar6 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar6 = uVar1;
      }
      iVar5 = 0;
      if (((x->super_bit_array_impl).m_data._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar6 >> 6] >>
           ((ulong)uVar1 & 0x3f) & 1) != 0) {
        iVar5 = (slv->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[*(int *)local_30._8_8_];
      }
      iVar4 = iVar4 + iVar5;
      local_30._8_8_ = local_30._8_8_ + 8;
    } while (local_30._8_8_ != local_30._0_8_);
  }
  pbVar2 = (slv->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>_>::bound_factor_*,_false>
           ._M_head_impl;
  if (iVar4 < pbVar2[k].min) {
    bVar3 = false;
  }
  else {
    bVar3 = iVar4 <= pbVar2[k].max;
  }
  return bVar3;
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}